

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

string * helics::typeNameStringRef_abi_cxx11_(DataType type)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  allocator<char> local_18;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   doubleString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_,
               "double",&local_11);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   intString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_,
               "int64",&local_12);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   stringString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_,
               "string",&local_13);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   complexString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_,
               "complex",&local_14);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   boolString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_,
               "bool",&local_15);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   doubleVecString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_
               ,"double_vector",&local_16);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_)
    ;
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   complexVecString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_,
               "complex_vector",&local_17);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_
                       );
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   namedPointString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_,
               "named_point",&local_18);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_
                       );
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   timeString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_,
               "time",&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   jsonString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_,
               "json",&local_1a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   charString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_,
               "char",&local_1b);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   anyString_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_,"any"
               ,&local_1c);
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_);
  }
  if ((typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                   nullString_abi_cxx11_), iVar1 != 0)) {
    typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_.field_2;
    typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_._M_string_length = 0;
    typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_.field_2._M_local_buf[0] =
         '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_);
  }
  switch(type) {
  case HELICS_STRING:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_;
    break;
  case HELICS_DOUBLE:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_;
    break;
  case HELICS_INT:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_;
    break;
  case HELICS_COMPLEX:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_;
    break;
  case HELICS_VECTOR:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_;
    break;
  case HELICS_COMPLEX_VECTOR:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_;
    break;
  case HELICS_NAMED_POINT:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_;
    break;
  case HELICS_BOOL:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_;
    break;
  case HELICS_TIME:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_;
    break;
  case HELICS_CHAR:
    psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_;
    break;
  default:
    if (type == HELICS_JSON) {
      psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_;
    }
    else if (type == HELICS_ANY) {
      psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_;
    }
    else {
      psVar2 = &typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_;
    }
  }
  return psVar2;
}

Assistant:

const std::string& typeNameStringRef(DataType type)
{
    static const std::string doubleString("double");
    static const std::string intString("int64");
    static const std::string stringString("string");
    static const std::string complexString("complex");
    static const std::string boolString("bool");
    static const std::string doubleVecString("double_vector");
    static const std::string complexVecString("complex_vector");
    static const std::string namedPointString("named_point");
    static const std::string timeString("time");
    static const std::string jsonString("json");
    static const std::string charString("char");
    static const std::string anyString("any");
    static const std::string nullString;
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return doubleString;
        case DataType::HELICS_INT:
            return intString;
        case DataType::HELICS_BOOL:
            return boolString;
        case DataType::HELICS_STRING:
            return stringString;
        case DataType::HELICS_COMPLEX:
            return complexString;
        case DataType::HELICS_TIME:
            return timeString;
        case DataType::HELICS_VECTOR:
            return doubleVecString;
        case DataType::HELICS_COMPLEX_VECTOR:
            return complexVecString;
        case DataType::HELICS_NAMED_POINT:
            return namedPointString;
        case DataType::HELICS_JSON:
            return jsonString;
        case DataType::HELICS_CHAR:
            return charString;
        case DataType::HELICS_ANY:
            return anyString;
        default:
            return nullString;
    }
}